

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

JSON __thiscall JSON::getDictItem(JSON *this,string *key)

{
  long *plVar1;
  _Base_ptr p_Var2;
  long lVar3;
  const_iterator cVar4;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  JSON JVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  plVar1 = (long *)(key->_M_dataplus)._M_p;
  if ((plVar1 == (long *)0x0) || (lVar3 = *plVar1, lVar3 == 0)) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(lVar3,&JSON_value::typeinfo,&JSON_dictionary::typeinfo,0);
  }
  if (lVar3 != 0) {
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                    *)(lVar3 + 0x10),in_RDX);
    if (cVar4._M_node != (_Base_ptr)(lVar3 + 0x18)) {
      (this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(cVar4._M_node + 2);
      p_Var2 = cVar4._M_node[2]._M_parent;
      (this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
      _Var5._M_pi = extraout_RDX;
      if (p_Var2 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
        }
      }
      goto LAB_001223bb;
    }
  }
  JVar6 = makeNull();
  _Var5._M_pi = JVar6.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
LAB_001223bb:
  JVar6.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  JVar6.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar6.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::getDictItem(std::string const& key) const
{
    if (auto v = m ? dynamic_cast<JSON_dictionary const*>(m->value.get()) : nullptr) {
        if (auto it = v->members.find(key); it != v->members.end()) {
            return it->second;
        }
    }
    return makeNull();
}